

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * duckdb_fmt::v6::internal::
       parse_arg_id<char,duckdb_fmt::v6::internal::precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>
  *psVar2;
  int arg_id;
  byte *pbVar3;
  byte *pbVar4;
  unsigned_long_long uVar5;
  undefined8 uVar6;
  byte *pbVar7;
  undefined1 *puVar8;
  undefined1 *unaff_R12;
  undefined1 *puVar9;
  basic_string_view<char> name;
  error_handler local_d1;
  byte *local_d0;
  string local_c8;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_15_055d57a1_for_value<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar1 = *begin;
  local_d0 = (byte *)begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
    ::on_dynamic_precision<duckdb_fmt::v6::internal::auto_id>
              (&handler->handler->
                super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
              );
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      arg_id = parse_nonnegative_int<char,duckdb_fmt::v6::internal::precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>&>
                         ((char **)&local_d0,end,handler);
      if ((local_d0 != (byte *)end) && ((*local_d0 == 0x3a || (*local_d0 == 0x7d)))) {
        specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
        ::on_dynamic_precision<int>
                  (&handler->handler->
                    super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                   ,arg_id);
        return (char *)local_d0;
      }
      puVar9 = local_78;
      local_88 = puVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"invalid format string","");
      psVar2 = handler->handler;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_88,local_88 + local_80);
      specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error(&psVar2->
                  super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                 ,&local_c8);
      puVar8 = local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
        puVar8 = local_88;
      }
    }
    else {
      if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
        pbVar4 = (byte *)(begin + 1);
        do {
          pbVar3 = pbVar4;
          pbVar7 = (byte *)end;
          if (pbVar3 == (byte *)end) break;
          bVar1 = *pbVar3;
          pbVar4 = pbVar3 + 1;
        } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
                (pbVar7 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
        name.size_ = (long)pbVar7 - (long)begin;
        psVar2 = handler->handler;
        name.data_ = begin;
        basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>
        ::arg((format_arg *)&local_68.string,
              (psVar2->
              super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
              ).context_,name);
        local_48.long_long_value = local_68.long_long_value;
        local_48.string.size = local_68.string.size;
        local_38 = local_58;
        uStack_30 = uStack_50;
        local_c8._M_dataplus._M_p = (pointer)&local_d1;
        uVar5 = visit_format_arg<duckdb_fmt::v6::internal::precision_checker<duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>
                          ((precision_checker<duckdb_fmt::v6::internal::error_handler> *)&local_c8,
                           (basic_format_arg<duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                            *)&local_48.string);
        if ((uVar5 & 0xffffffff80000000) == 0) {
          ((psVar2->
           super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
           ).super_specs_setter<char>.specs_)->precision = (int)uVar5;
          return (char *)pbVar7;
        }
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"number is too big","");
        uVar6 = duckdb_fmt::v6::internal::error_handler::on_error(&local_d1,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        if (local_a8 != unaff_R12) {
          operator_delete(local_a8);
        }
        _Unwind_Resume(uVar6);
      }
      puVar9 = local_98;
      local_a8 = puVar9;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a8,"invalid format string","");
      psVar2 = handler->handler;
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_c8,local_a8,local_a8 + local_a0);
      specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
      ::on_error(&psVar2->
                  super_specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>
                 ,&local_c8);
      puVar8 = local_a8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p);
        puVar8 = local_a8;
      }
    }
    if (puVar8 != puVar9) {
      operator_delete(puVar8);
    }
  }
  return (char *)local_d0;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}